

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureVectorizer.pb.cc
# Opt level: O2

void CoreML::Specification::protobuf_FeatureVectorizer_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_003a3c60 == '\x01') {
    DAT_003a3c60 = '\0';
    (*(code *)*_FeatureVectorizer_InputColumn_default_instance_)();
  }
  if (DAT_003a3c98 == '\x01') {
    DAT_003a3c98 = 0;
    (*(code *)*_FeatureVectorizer_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _FeatureVectorizer_InputColumn_default_instance_.Shutdown();
  _FeatureVectorizer_default_instance_.Shutdown();
}